

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::balanceDivide
          (InterpretedLiteralEvaluator *this,Interpretation multiply,Term *AoverB,TermList A,
          TermList C,TermList *result,bool *swap)

{
  TermList trm;
  bool bVar1;
  Entry *in_R8;
  undefined8 *in_R9;
  byte *in_stack_00000008;
  RationalConstantType bcon;
  TermList B;
  uint mul;
  undefined4 in_stack_ffffffffffffff48;
  Interpretation in_stack_ffffffffffffff4c;
  Signature *in_stack_ffffffffffffff50;
  Theory *this_00;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  TermList in_stack_ffffffffffffff68;
  TermList in_stack_ffffffffffffff70;
  undefined1 local_88 [56];
  uint64_t local_50;
  TermList local_48;
  uint local_3c;
  undefined8 *local_38;
  Entry *local_18;
  TermList local_10;
  byte local_1;
  
  local_38 = in_R9;
  local_18 = in_R8;
  local_3c = Signature::getInterpretingSymbol(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  local_48 = Term::termArg((Term *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                           (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  bVar1 = TermList::operator!=(&local_48,&local_10);
  if (bVar1) {
    local_1 = 0;
  }
  else {
    local_88._32_8_ =
         Term::termArg((Term *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
                       (uint)((ulong)in_stack_ffffffffffffff50 >> 0x20));
    local_88._40_8_ = local_18;
    local_50 = local_88._32_8_;
    Term::create2(in_stack_ffffffffffffff64,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    TermList::TermList((TermList *)in_stack_ffffffffffffff50,
                       (Term *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    *local_38 = local_88._48_8_;
    this_00 = (Theory *)local_88;
    RationalConstantType::RationalConstantType
              ((RationalConstantType *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
              );
    trm._content._7_1_ = in_stack_ffffffffffffff5f;
    trm._content._0_7_ = in_stack_ffffffffffffff58;
    bVar1 = Theory::tryInterpretConstant
                      (this_00,trm,
                       (RationalConstantType *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    if (bVar1) {
      bVar1 = RationalConstantType::isNegative((RationalConstantType *)0x8771bc);
      if (bVar1) {
        *in_stack_00000008 = (*in_stack_00000008 ^ 0xff) & 1;
      }
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
    RationalConstantType::~RationalConstantType((RationalConstantType *)this_00);
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool InterpretedLiteralEvaluator::balanceDivide(Interpretation multiply, 
                       Term* AoverB, TermList A, TermList C, TermList& result, bool& swap)
{
#if VDEBUG
    TermList srt = theory->getOperationSort(multiply); 
    ASS(srt == AtomicSort::realSort() || srt == AtomicSort::rationalSort());
#endif

    unsigned mul = env.signature->getInterpretingSymbol(multiply);
    if(AoverB->termArg(0)!=A)return false;

    auto B = AoverB->termArg(1);

    result = TermList(Term::create2(mul,C,B));

    RationalConstantType bcon;
    if(theory->tryInterpretConstant(B,bcon)){
      ASS(!bcon.isZero());
      if(bcon.isNegative()){ swap=!swap; } // switch the polarity of an inequality if we're under one
      return true;
    }
    // Unsure exactly what the best thing to do here, so for now give up
    // This means we only balance when we have a constant on the variable side
    return false;    
}